

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::MTex>
          (Structure *this,MTex *dest,FileDatabase *db)

{
  element_type *this_00;
  _Rb_tree_color local_28;
  _Rb_tree_color local_24;
  int temp;
  int temp_short;
  FileDatabase *db_local;
  MTex *dest_local;
  Structure *this_local;
  
  local_24 = _S_red;
  _temp = db;
  db_local = (FileDatabase *)dest;
  dest_local = (MTex *)this;
  ReadField<1,int>(this,(int *)&local_24,"mapto",db);
  (db_local->dna).converters._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_24;
  local_28 = _S_red;
  ReadField<1,int>(this,(int *)&local_28,"blendtype",_temp);
  *(_Rb_tree_color *)
   &(db_local->dna).converters._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 = local_28;
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Object>
            (this,(shared_ptr<Assimp::Blender::Object> *)
                  &(db_local->dna).converters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
             ,"*object",_temp,false);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Tex>
            (this,(shared_ptr<Assimp::Blender::Tex> *)
                  &(db_local->dna).converters._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
             "*tex",_temp,false);
  ReadFieldArray<1,char,32ul>(this,(char (*) [32])&(db_local->dna).structures,"uvname",_temp);
  ReadField<1,int>(this,(int *)&local_28,"projx",_temp);
  (db_local->dna).indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_28;
  ReadField<1,int>(this,(int *)&local_28,"projy",_temp);
  *(_Rb_tree_color *)&(db_local->dna).indices._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4
       = local_28;
  ReadField<1,int>(this,(int *)&local_28,"projz",_temp);
  *(_Rb_tree_color *)&(db_local->dna).indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = local_28;
  ReadField<1,char>(this,(char *)((long)&(db_local->dna).indices._M_t._M_impl.super__Rb_tree_header.
                                         _M_header._M_parent + 4),"mapping",_temp);
  ReadFieldArray<1,float,3ul>
            (this,(float (*) [3])
                  &(db_local->dna).indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             "ofs",_temp);
  ReadFieldArray<1,float,3ul>
            (this,(float (*) [3])
                  ((long)&(db_local->dna).indices._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_right + 4),"size",_temp);
  ReadField<1,float>(this,(float *)&db_local->reader,"rot",_temp);
  ReadField<1,int>(this,(int *)((long)&(db_local->reader).
                                       super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + 4),"texflag",_temp);
  ReadField<1,short>(this,(short *)&(db_local->reader).
                                    super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,"colormodel",_temp);
  ReadField<1,short>(this,(short *)((long)&(db_local->reader).
                                           super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi + 2),"pmapto",_temp);
  ReadField<1,short>(this,(short *)((long)&(db_local->reader).
                                           super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi + 4),"pmaptoneg",_temp);
  ReadField<1,float>(this,(float *)&db_local->entries,"r",_temp);
  ReadField<1,float>(this,(float *)((long)&(db_local->entries).
                                           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           .
                                           super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 4),"g",_temp)
  ;
  ReadField<1,float>(this,(float *)&(db_local->entries).
                                    super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                    .
                                    super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,"b",_temp);
  ReadField<1,float>(this,(float *)((long)&(db_local->entries).
                                           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           .
                                           super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           ._M_impl.super__Vector_impl_data._M_finish + 4),"k",_temp
                    );
  ReadField<1,float>(this,(float *)((long)&(db_local->entries).
                                           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           .
                                           super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                     "colspecfac",_temp);
  ReadField<1,float>(this,(float *)&db_local->_stats,"mirrfac",_temp);
  ReadField<1,float>(this,(float *)&(db_local->_stats).pointers_resolved,"alphafac",_temp);
  ReadField<1,float>(this,(float *)&(db_local->_stats).cache_hits,"difffac",_temp);
  ReadField<1,float>(this,(float *)&(db_local->_stats).cached_objects,"specfac",_temp);
  ReadField<1,float>(this,(float *)&db_local->field_0xb8,"emitfac",_temp);
  ReadField<1,float>(this,(float *)&db_local->field_0xbc,"hardfac",_temp);
  ReadField<1,float>(this,(float *)&(db_local->entries).
                                    super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                    .
                                    super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"norfac",
                     _temp);
  this_00 = ::std::
            __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&_temp->reader);
  StreamReader<true,_true>::IncPtr(this_00,this->size);
  return;
}

Assistant:

void Structure :: Convert<MTex> (
    MTex& dest,
    const FileDatabase& db
    ) const
{

    int temp_short = 0;
    ReadField<ErrorPolicy_Igno>(temp_short,"mapto",db);
    dest.mapto = static_cast<Assimp::Blender::MTex::MapType>(temp_short);
    int temp = 0;
    ReadField<ErrorPolicy_Igno>(temp,"blendtype",db);
    dest.blendtype = static_cast<Assimp::Blender::MTex::BlendType>(temp);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.object,"*object",db);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.tex,"*tex",db);
    ReadFieldArray<ErrorPolicy_Igno>(dest.uvname,"uvname",db);
    ReadField<ErrorPolicy_Igno>(temp,"projx",db);
    dest.projx = static_cast<Assimp::Blender::MTex::Projection>(temp);
    ReadField<ErrorPolicy_Igno>(temp,"projy",db);
    dest.projy = static_cast<Assimp::Blender::MTex::Projection>(temp);
    ReadField<ErrorPolicy_Igno>(temp,"projz",db);
    dest.projz = static_cast<Assimp::Blender::MTex::Projection>(temp);
    ReadField<ErrorPolicy_Igno>(dest.mapping,"mapping",db);
    ReadFieldArray<ErrorPolicy_Igno>(dest.ofs,"ofs",db);
    ReadFieldArray<ErrorPolicy_Igno>(dest.size,"size",db);
    ReadField<ErrorPolicy_Igno>(dest.rot,"rot",db);
    ReadField<ErrorPolicy_Igno>(dest.texflag,"texflag",db);
    ReadField<ErrorPolicy_Igno>(dest.colormodel,"colormodel",db);
    ReadField<ErrorPolicy_Igno>(dest.pmapto,"pmapto",db);
    ReadField<ErrorPolicy_Igno>(dest.pmaptoneg,"pmaptoneg",db);
    ReadField<ErrorPolicy_Warn>(dest.r,"r",db);
    ReadField<ErrorPolicy_Warn>(dest.g,"g",db);
    ReadField<ErrorPolicy_Warn>(dest.b,"b",db);
    ReadField<ErrorPolicy_Warn>(dest.k,"k",db);
    ReadField<ErrorPolicy_Igno>(dest.colspecfac,"colspecfac",db);
    ReadField<ErrorPolicy_Igno>(dest.mirrfac,"mirrfac",db);
    ReadField<ErrorPolicy_Igno>(dest.alphafac,"alphafac",db);
    ReadField<ErrorPolicy_Igno>(dest.difffac,"difffac",db);
    ReadField<ErrorPolicy_Igno>(dest.specfac,"specfac",db);
    ReadField<ErrorPolicy_Igno>(dest.emitfac,"emitfac",db);
    ReadField<ErrorPolicy_Igno>(dest.hardfac,"hardfac",db);
    ReadField<ErrorPolicy_Igno>(dest.norfac,"norfac",db);

    db.reader->IncPtr(size);
}